

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

void __thiscall
tonk::SessionOutgoing::sendQueuedDatagram
          (SessionOutgoing *this,OutgoingQueuedDatagram *datagram,uint sequenceNumberBytes,
          uint sequenceNumber)

{
  int iVar1;
  IUDPSender *pIVar2;
  ushort *puVar3;
  ushort *puVar4;
  bool bVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint64_t uVar10;
  undefined4 in_ECX;
  uint32_t timestamp24_00;
  uint8_t *puVar11;
  uint in_EDX;
  long in_RSI;
  SessionOutgoing *in_RDI;
  uint compressionSavings;
  uint32_t timestamp24;
  uint64_t nowUsec;
  DatagramBuffer datagramBuffer;
  uint sendBytes;
  uint8_t *tagData;
  uint16_t tag;
  uint8_t *timestampData;
  uint taggedBytes;
  uint64_t a;
  uint32_t b;
  NonceT nonce;
  uint nonceBytes;
  uint8_t flags;
  uint8_t *footer;
  uint targetPadBytes;
  uint paddingBytes;
  uint messageBytes;
  uint8_t *datagramData;
  uint headerWord;
  atomic<bool> *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  uint bytes;
  uint8_t *in_stack_fffffffffffffe68;
  SimpleCipher *this_00;
  SimpleCipher *in_stack_fffffffffffffe70;
  SenderBandwidthControl *pSVar12;
  uint64_t in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffea4;
  uint8_t *in_stack_fffffffffffffea8;
  SimpleCipher *in_stack_fffffffffffffeb0;
  uint local_f0;
  byte local_e9;
  ushort *local_e8;
  uint local_dc;
  int local_d8;
  uint local_d4;
  long local_d0;
  undefined4 local_c8;
  uint local_c4;
  long local_c0;
  uint local_b0;
  undefined4 local_ac;
  uint8_t *local_a8;
  uint local_9c;
  uint local_98;
  undefined4 local_94;
  undefined2 *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  undefined8 local_78;
  uint8_t *local_70;
  undefined4 local_64;
  uint8_t *local_60;
  uint32_t local_54;
  uint8_t *local_50;
  undefined2 local_42;
  uint8_t *local_40;
  undefined2 local_32;
  undefined2 *local_30;
  ushort local_22;
  ushort *local_20;
  byte local_11;
  int local_10;
  int local_c;
  SenderBandwidthControl *local_8;
  
  bytes = (uint)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_d0 = in_RSI + 0x10;
  local_d4 = *(uint *)(in_RSI + 8);
  local_d8 = 0;
  local_c8 = in_ECX;
  local_c4 = in_EDX;
  local_c0 = in_RSI;
  if ((((in_RDI->Deps).EnablePadding & 1U) != 0) &&
     (local_d4 + 2 <= (in_RDI->super_OutgoingQueueCommon).MaxMessageSectionBytes)) {
    uVar8 = siamese::PCGRandom::Next(&in_RDI->PaddingPRNG);
    local_dc = (uint)(byte)TONK_RAND_PAD_EXP[uVar8 & 0xff];
    if ((in_RDI->super_OutgoingQueueCommon).MaxMessageSectionBytes < local_d4 + local_dc) {
      local_dc = (in_RDI->super_OutgoingQueueCommon).MaxMessageSectionBytes - local_d4;
    }
    if (1 < local_dc) {
      local_90 = (undefined2 *)(local_d0 + (ulong)local_d4);
      local_98 = local_dc - 2;
      local_94 = 4;
      local_9c = local_98 | 0x2000;
      local_32 = (undefined2)local_9c;
      *local_90 = local_32;
      local_30 = local_90;
      memset((void *)(local_d0 + (ulong)local_d4 + 2),0,(ulong)(local_dc - 2));
      local_d8 = local_dc + local_d8;
      local_d4 = local_dc + local_d4;
    }
  }
  puVar11 = (uint8_t *)(local_d0 + (ulong)local_d4);
  local_e9 = 0x80;
  if ((in_RDI->ShouldCompressSequenceNumbers & 1U) != 0) {
    local_e9 = 0xa0;
  }
  local_e8 = (ushort *)puVar11;
  if (local_c4 != 0) {
    local_e9 = local_e9 | (byte)local_c4;
    local_ac = local_c8;
    local_b0 = local_c4;
    *(undefined4 *)puVar11 = local_c8;
    local_e8 = (ushort *)(puVar11 + local_c4);
    local_a8 = puVar11;
  }
  writeNonce(in_RDI,(uint8_t *)local_e8,&local_f0);
  local_e9 = local_e9 | (byte)(local_f0 << 2);
  local_e8 = (ushort *)((long)local_e8 + (ulong)local_f0);
  bVar5 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe58);
  if (bVar5) {
    local_e9 = local_e9 | 0x40;
    local_88 = in_RDI->Handshake + 8;
    local_64 = *(undefined4 *)local_88;
    local_80 = in_RDI->Handshake;
    local_78 = *(undefined8 *)local_80;
    local_70 = (uint8_t *)local_e8;
    *(undefined8 *)local_e8 = local_78;
    local_60 = (uint8_t *)((long)local_e8 + 8);
    *(undefined4 *)local_60 = local_64;
    local_e8 = (ushort *)((long)local_e8 + 0xc);
  }
  puVar3 = local_e8;
  iVar9 = (int)local_d0;
  iVar1 = (int)local_e8;
  *(byte *)((long)local_e8 + 3) = local_e9;
  local_e8 = (ushort *)((long)local_e8 + 4);
  security::SimpleCipher::Cipher
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
             in_stack_fffffffffffffe98);
  uVar6 = security::SimpleCipher::Tag
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,bytes,
                     (uint64_t)in_stack_fffffffffffffe58);
  puVar4 = local_e8;
  iVar9 = (iVar1 - iVar9) + 6;
  DatagramBuffer::DatagramBuffer((DatagramBuffer *)&stack0xfffffffffffffeb0);
  uVar10 = siamese::GetTimeUsec();
  timestamp24_00 = (uint32_t)(uVar10 >> 3);
  this_00 = &in_RDI->Encryptor;
  uVar8 = protocol::TimestampFlagTagInt(timestamp24_00,local_e9);
  uVar7 = security::SimpleCipher::TagInt(this_00,uVar8);
  local_22 = uVar6 ^ uVar7;
  local_50 = (uint8_t *)puVar3;
  *(uint8_t *)((long)puVar3 + 2) = (uint8_t)(timestamp24_00 >> 0x10);
  local_40 = (uint8_t *)puVar3;
  local_42 = (undefined2)timestamp24_00;
  *puVar3 = local_42;
  local_20 = puVar4;
  *puVar4 = local_22;
  iVar1 = *(int *)(local_c0 + 0xc);
  pIVar2 = (in_RDI->Deps).UDPSender;
  local_54 = timestamp24_00;
  (*pIVar2->_vptr_IUDPSender[2])(pIVar2,&in_RDI->PeerUDPAddress,(in_RDI->Deps).ConnectionRef);
  pSVar12 = (in_RDI->Deps).SenderControl;
  local_11 = local_c4 != 0;
  local_10 = iVar9;
  local_c = iVar1;
  local_8 = pSVar12;
  std::__atomic_base<int>::operator-=(&(pSVar12->AvailableTokens).super___atomic_base<int>,iVar9);
  if ((local_11 & 1) != 0) {
    pSVar12->RecoverySendTokens = pSVar12->RecoverySendTokens + 0x400;
  }
  pSVar12->ProbeSendTokens = local_10 + local_c + pSVar12->ProbeSendTokens;
  return;
}

Assistant:

void SessionOutgoing::sendQueuedDatagram(
    OutgoingQueuedDatagram* datagram,
    unsigned sequenceNumberBytes,
    unsigned sequenceNumber)
{
    // If this function changes, also update PostRecovery() and PostDummyDatagram() to keep it in sync.

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = datagram->NextWriteOffset;

    TONK_DEBUG_ASSERT(messageBytes > 0);

#ifdef TONK_ENABLE_RANDOM_PADDING
    unsigned paddingBytes = 0;

    // If there is room for one more message in the datagram:
    if (Deps.EnablePadding &&
        messageBytes + protocol::kMessageFrameBytes <= MaxMessageSectionBytes)
    {
        // Select the number of bytes to pad
        unsigned targetPadBytes = TONK_RAND_PAD_EXP[PaddingPRNG.Next() % 256];

        TONK_DEBUG_ASSERT(targetPadBytes <= protocol::kMaxRandomPaddingBytes);
        if (messageBytes + targetPadBytes > MaxMessageSectionBytes) {
            targetPadBytes = MaxMessageSectionBytes - messageBytes;
        }

        // If there is at least a frame worth of padding:
        if (targetPadBytes >= protocol::kMessageFrameBytes)
        {
            // Write frame header
            protocol::WriteMessageFrameHeader(
                datagramData + messageBytes,
                protocol::MessageType_Padding,
                targetPadBytes - protocol::kMessageFrameBytes);

            // Zero the padding bytes to avoid sending confidential data
            memset(
                datagramData + messageBytes + protocol::kMessageFrameBytes,
                0,
                targetPadBytes - protocol::kMessageFrameBytes);

            paddingBytes += targetPadBytes;
            messageBytes += targetPadBytes;
        }
    }
#endif // TONK_ENABLE_RANDOM_PADDING

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    if (sequenceNumberBytes > 0)
    {
        flags |= sequenceNumberBytes;
        protocol::WriteFooterField(footer, sequenceNumber, sequenceNumberBytes);
        footer += sequenceNumberBytes;
    }

    // Write packet nonce to header
    unsigned nonceBytes;
    const NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    // Encrypt message data but not the footer
    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Generate the main packet data tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

    TONK_VERBOSE_OUTGOING_LOG("sendQueuedDatagram: datagram = ", datagram, " sequenceNumber=",
        sequenceNumber, " sequenceNumberBytes=", sequenceNumberBytes, " bytes=", datagramBuffer.Bytes);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    for (int i = 0; i < Stats_QueueCount; ++i) {
        stats->Stats[i] += datagram->Stats[i];
    }
    stats->Stats[Stats_PaddingBytesSent] += paddingBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    const unsigned compressionSavings = datagram->CompressionSavings;

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        compressionSavings,
        sendBytes,
        sequenceNumberBytes > 0);
}